

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O0

void * matras_touch_no_check(matras *m,matras_id_t id)

{
  uint uVar1;
  void **ppvVar2;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  void *new_extent_2;
  char *extent3p;
  char *extent3;
  void *new_extent_1;
  void **extent2p;
  void **extent2;
  void *new_extent;
  void **extent1p;
  void **extent1;
  matras_id_t n3;
  matras_id_t n2;
  matras_id_t n1;
  matras_id_t id_local;
  matras *m_local;
  
  _Var3 = matras_needs_touch(m,id);
  if (!_Var3) {
    __assert_fail("matras_needs_touch(m, id)",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x1cd,"void *matras_touch_no_check(struct matras *, matras_id_t)");
  }
  uVar4 = id >> ((byte)m->shift1 & 0x1f);
  uVar5 = (id & m->mask1) >> ((byte)m->shift2 & 0x1f);
  uVar1 = m->mask2;
  extent1p = (void **)(m->head).root;
  ppvVar2 = (void **)((m->head).prev_view)->root;
  if (extent1p == ppvVar2) {
    extent1p = (void **)matras_copy_read_view_extent(m,extent1p);
    if (extent1p == (void **)0x0) {
      return (void *)0x0;
    }
    (m->head).root = extent1p;
  }
  extent2p = (void **)extent1p[uVar4];
  ppvVar2 = (void **)ppvVar2[uVar4];
  if (extent2p == ppvVar2) {
    extent2p = (void **)matras_copy_read_view_extent(m,extent2p);
    if (extent2p == (void **)0x0) {
      return (void *)0x0;
    }
    extent1p[uVar4] = extent2p;
  }
  extent3p = (char *)extent2p[uVar5];
  if (extent3p == (char *)ppvVar2[uVar5]) {
    extent3p = (char *)matras_copy_read_view_extent(m,extent3p);
    if (extent3p == (char *)0x0) {
      return (void *)0x0;
    }
    extent2p[uVar5] = extent3p;
  }
  return extent3p + (id & uVar1) * m->block_size;
}

Assistant:

void *
matras_touch_no_check(struct matras *m, matras_id_t id)
{
	assert(matras_needs_touch(m, id));

	/* see "Shifts and masks explanation" for details */
	matras_id_t n1 = id >> m->shift1;
	matras_id_t n2 = (id & m->mask1) >> m->shift2;
	matras_id_t n3 = id & m->mask2;

	void **extent1 = (void **)m->head.root;
	void **extent1p = (void **)m->head.prev_view->root;
	if (extent1 == extent1p) {
		void *new_extent = matras_copy_read_view_extent(m, extent1);
		if (!new_extent)
			return 0;
		m->head.root = new_extent;
		extent1 = (void **)new_extent;
	}

	void **extent2 = (void **)extent1[n1];
	void **extent2p = (void **)extent1p[n1];
	if (extent2 == extent2p) {
		void *new_extent = matras_copy_read_view_extent(m, extent2);
		if (!new_extent)
			return 0;
		extent1[n1] = new_extent;
		extent2 = (void **)new_extent;
	}

	char *extent3 = (char *)extent2[n2];
	char *extent3p = (char *)extent2p[n2];
	if (extent3 == extent3p) {
		void *new_extent = matras_copy_read_view_extent(m, extent3);
		if (!new_extent)
			return 0;
		extent2[n2] = new_extent;
		extent3 = (char *)new_extent;
	}

	return &extent3[n3 * m->block_size];
}